

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replicode_common.h
# Opt level: O1

void __thiscall r_exec::Input::Input(Input *this,Input *original)

{
  _Object *p_Var1;
  
  p_Var1 = (original->bindings).object;
  (this->bindings).object = p_Var1;
  if (p_Var1 != (_Object *)0x0) {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  p_Var1 = (original->abstraction).object;
  (this->abstraction).object = p_Var1;
  if (p_Var1 != (_Object *)0x0) {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  p_Var1 = (original->input).object;
  (this->input).object = p_Var1;
  if (p_Var1 != (_Object *)0x0) {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  this->eligible_cause = original->eligible_cause;
  this->ijt = original->ijt;
  return;
}

Assistant:

inline P(const P<C> &p) : object(p.object)
    {
        if (object) {
            object->incRef();
        }
    }